

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O3

Status __thiscall leveldb::RecoveryTest::OpenWithStatus(RecoveryTest *this,Options *options)

{
  long lVar1;
  undefined8 *in_RDX;
  Options *pOVar2;
  byte bVar3;
  Options opts;
  Options local_80;
  
  bVar3 = 0;
  if ((long *)options->block_size != (long *)0x0) {
    (**(code **)(*(long *)options->block_size + 8))();
  }
  options->block_size = 0;
  Options::Options(&local_80);
  if (in_RDX == (undefined8 *)0x0) {
    local_80.reuse_logs = true;
    local_80.create_if_missing = true;
  }
  else {
    pOVar2 = &local_80;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      pOVar2->comparator = (Comparator *)*in_RDX;
      in_RDX = in_RDX + (ulong)bVar3 * -2 + 1;
      pOVar2 = (Options *)((long)pOVar2 + ((ulong)bVar3 * -2 + 1) * 8);
    }
  }
  if ((Cache *)local_80.env == (Cache *)0x0) {
    local_80.env = (Env *)options->block_cache;
  }
  DB::Open((DB *)this,&local_80,(string *)&options->env,(DB **)&options->block_size);
  return (Status)(char *)this;
}

Assistant:

Status OpenWithStatus(Options* options = nullptr) {
    Close();
    Options opts;
    if (options != nullptr) {
      opts = *options;
    } else {
      opts.reuse_logs = true;  // TODO(sanjay): test both ways
      opts.create_if_missing = true;
    }
    if (opts.env == nullptr) {
      opts.env = env_;
    }
    return DB::Open(opts, dbname_, &db_);
  }